

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O1

wchar_t sg_append_buffer(sg_buffer buf_id,sg_range *data)

{
  wchar_t *pwVar1;
  sg_buffer_type sVar2;
  GLuint buffer;
  bool bVar3;
  wchar_t wVar4;
  int iVar5;
  _sg_buffer_t *p_Var6;
  long lVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  GLenum target;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                  ,0x40b6,"int sg_append_buffer(sg_buffer, const sg_range *)");
  }
  if ((data == (sg_range *)0x0) || (data->ptr == (void *)0x0)) {
    __assert_fail("data && data->ptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                  ,0x40b7,"int sg_append_buffer(sg_buffer, const sg_range *)");
  }
  if (buf_id.id != 0) {
    p_Var6 = _sg_buffer_at((_sg_pools_t *)(ulong)buf_id.id,(uint32_t)data);
    if ((p_Var6->slot).id == buf_id.id) goto LAB_00117190;
  }
  p_Var6 = (_sg_buffer_t *)0x0;
LAB_00117190:
  if (p_Var6 == (_sg_buffer_t *)0x0) {
    wVar9 = L'\0';
  }
  else {
    if ((p_Var6->cmn).append_frame_index != _sg.frame_index) {
      (p_Var6->cmn).append_pos = L'\0';
      (p_Var6->cmn).append_overflow = false;
    }
    wVar9 = (p_Var6->cmn).append_pos;
    if ((p_Var6->cmn).size < ((int)data->size + 3U & 0xfffffffc) + wVar9) {
      (p_Var6->cmn).append_overflow = true;
    }
    if ((p_Var6->slot).state == SG_RESOURCESTATE_VALID) {
      if (_sg.desc.disable_validation == false) {
        if (data->ptr == (void *)0x0) {
          __assert_fail("buf && data && data->ptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                        ,0x3ae6,
                        "_Bool _sg_validate_append_buffer(const _sg_buffer_t *, const sg_range *)");
        }
        _sg.validate_error = _SG_VALIDATE_SUCCESS;
        if ((p_Var6->cmn).usage == SG_USAGE_IMMUTABLE) {
          _sg.validate_error = _SG_VALIDATE_APPENDBUF_USAGE;
          if (_sg.desc.logger.log_cb == (_func_void_char_ptr_void_ptr *)0x0) {
            puts("sg_append_buffer: cannot append to immutable buffer");
          }
          else {
            (*_sg.desc.logger.log_cb)
                      ("sg_append_buffer: cannot append to immutable buffer",
                       _sg.desc.logger.user_data);
          }
        }
        if ((p_Var6->cmn).size < (p_Var6->cmn).append_pos + (int)data->size) {
          _sg.validate_error = _SG_VALIDATE_APPENDBUF_SIZE;
          if (_sg.desc.logger.log_cb == (_func_void_char_ptr_void_ptr *)0x0) {
            puts("sg_append_buffer: overall appended size is bigger than buffer size");
          }
          else {
            (*_sg.desc.logger.log_cb)
                      ("sg_append_buffer: overall appended size is bigger than buffer size",
                       _sg.desc.logger.user_data);
          }
        }
        if ((p_Var6->cmn).update_frame_index == _sg.frame_index) {
          _sg.validate_error = _SG_VALIDATE_APPENDBUF_UPDATE;
          if (_sg.desc.logger.log_cb == (_func_void_char_ptr_void_ptr *)0x0) {
            puts("sg_append_buffer: cannot call sg_append_buffer and sg_update_buffer in same frame"
                );
          }
          else {
            (*_sg.desc.logger.log_cb)
                      ("sg_append_buffer: cannot call sg_append_buffer and sg_update_buffer in same frame"
                       ,_sg.desc.logger.user_data);
          }
        }
        _sg_validate_end();
      }
      if (((p_Var6->cmn).append_overflow == false) && (data->size != 0)) {
        if ((p_Var6->cmn).update_frame_index == _sg.frame_index) {
          __assert_fail("buf->cmn.update_frame_index != _sg.frame_index",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                        ,0x40c8,"int sg_append_buffer(sg_buffer, const sg_range *)");
        }
        if (data->ptr == (void *)0x0) {
          __assert_fail("buf && data && data->ptr && (data->size > 0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                        ,0x1f8b,"int _sg_gl_append_buffer(_sg_buffer_t *, const sg_range *, _Bool)")
          ;
        }
        if ((p_Var6->cmn).append_frame_index != _sg.frame_index) {
          wVar4 = (p_Var6->cmn).active_slot + L'\x01';
          wVar8 = L'\0';
          if (wVar4 < (p_Var6->cmn).num_slots) {
            wVar8 = wVar4;
          }
          (p_Var6->cmn).active_slot = wVar8;
        }
        sVar2 = (p_Var6->cmn).type;
        if (sVar2 == SG_BUFFERTYPE_VERTEXBUFFER) {
          target = 0x8892;
          bVar3 = true;
        }
        else {
          if (sVar2 != SG_BUFFERTYPE_INDEXBUFFER) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                          ,0x154d,"GLenum _sg_gl_buffer_target(sg_buffer_type)");
          }
          target = 0x8893;
          bVar3 = false;
        }
        lVar7 = (long)(p_Var6->cmn).active_slot;
        if (1 < lVar7) {
          __assert_fail("buf->cmn.active_slot < SG_NUM_INFLIGHT_FRAMES",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                        ,0x1f92,"int _sg_gl_append_buffer(_sg_buffer_t *, const sg_range *, _Bool)")
          ;
        }
        buffer = (p_Var6->gl).buf[lVar7];
        if (buffer == 0) {
          __assert_fail("gl_buf",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                        ,0x1f94,"int _sg_gl_append_buffer(_sg_buffer_t *, const sg_range *, _Bool)")
          ;
        }
        iVar5 = glGetError();
        if (iVar5 != 0) {
          __assert_fail("glGetError() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                        ,0x1f95,"int _sg_gl_append_buffer(_sg_buffer_t *, const sg_range *, _Bool)")
          ;
        }
        if (bVar3) {
          _sg.gl.cache.stored_vertex_buffer = _sg.gl.cache.vertex_buffer;
        }
        else {
          _sg.gl.cache.stored_index_buffer = _sg.gl.cache.index_buffer;
        }
        _sg_gl_cache_bind_buffer(target,buffer);
        glBufferSubData(target,(long)(p_Var6->cmn).append_pos,data->size,data->ptr);
        _sg_gl_cache_restore_buffer_binding(target);
        iVar5 = glGetError();
        if (iVar5 != 0) {
          __assert_fail("glGetError() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                        ,0x1f9a,"int _sg_gl_append_buffer(_sg_buffer_t *, const sg_range *, _Bool)")
          ;
        }
        pwVar1 = &(p_Var6->cmn).append_pos;
        *pwVar1 = *pwVar1 + ((int)data->size + 3U & 0xfffffffc);
        (p_Var6->cmn).append_frame_index = _sg.frame_index;
      }
    }
  }
  return wVar9;
}

Assistant:

inline int sg_append_buffer(sg_buffer buf_id, const sg_range& data) { return sg_append_buffer(buf_id, &data); }